

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O0

bool __thiscall
dxil_spv::DXILContainerParser::parse_container
          (DXILContainerParser *this,void *data,size_t size,bool reflection)

{
  bool bVar1;
  FourCC FVar2;
  reference buffer;
  size_t sVar3;
  undefined1 local_120 [8];
  MemoryStream substream_3;
  MemoryStream substream_2;
  MemoryStream substream_1;
  MemoryStream substream;
  FourCC expected;
  FourCC fourcc;
  PartHeader part_header;
  uint *part_offset;
  iterator __end1;
  iterator __begin1;
  Vector<uint32_t> *__range1;
  uint local_88;
  allocator_type local_81;
  uint32_t i;
  Vector<uint32_t> parts;
  ContainerHeader container_header;
  MemoryStream stream;
  bool reflection_local;
  size_t size_local;
  void *data_local;
  DXILContainerParser *this_local;
  
  MemoryStream::MemoryStream((MemoryStream *)&container_header.container_size_in_bytes,data,size);
  bVar1 = MemoryStream::read<DXIL::ContainerHeader>
                    ((MemoryStream *)&container_header.container_size_in_bytes,
                     (ContainerHeader *)
                     &parts.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    if ((int)parts.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage == 0x43425844) {
      if (size < (uint)container_header.digest._12_4_) {
        this_local._7_1_ = false;
      }
      else {
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&i,
                   (ulong)(uint)container_header._20_4_,&local_81);
        for (local_88 = 0; local_88 < (uint)container_header._20_4_; local_88 = local_88 + 1) {
          buffer = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                   operator[]((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *
                              )&i,(ulong)local_88);
          bVar1 = MemoryStream::read<unsigned_int>
                            ((MemoryStream *)&container_header.container_size_in_bytes,buffer);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_001d83a8;
          }
        }
        __end1 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                            &i);
        part_offset = (uint *)std::
                              vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                              end((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   *)&i);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
                                           *)&part_offset), bVar1) {
          part_header = (PartHeader)
                        __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
                        ::operator*(&__end1);
          bVar1 = MemoryStream::seek((MemoryStream *)&container_header.container_size_in_bytes,
                                     (ulong)*(uint *)part_header);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_001d83a8;
          }
          bVar1 = MemoryStream::read<DXIL::PartHeader>
                            ((MemoryStream *)&container_header.container_size_in_bytes,
                             (PartHeader *)&expected);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_001d83a8;
          }
          if (((expected != FeatureInfo) && (expected != RootSignature)) &&
             (expected != PipelineStateValidation)) {
            if (expected == InputSignature) {
              sVar3 = MemoryStream::get_offset
                                ((MemoryStream *)&container_header.container_size_in_bytes);
              MemoryStream::create_substream
                        ((MemoryStream *)&substream_2.blob_offset,
                         (MemoryStream *)&container_header.container_size_in_bytes,sVar3,
                         (ulong)fourcc);
              bVar1 = parse_iosg1(this,(MemoryStream *)&substream_2.blob_offset,
                                  &this->input_elements);
              if (!bVar1) {
                this_local._7_1_ = false;
                goto LAB_001d83a8;
              }
            }
            else if (expected == OutputSignature) {
              sVar3 = MemoryStream::get_offset
                                ((MemoryStream *)&container_header.container_size_in_bytes);
              MemoryStream::create_substream
                        ((MemoryStream *)&substream_3.blob_offset,
                         (MemoryStream *)&container_header.container_size_in_bytes,sVar3,
                         (ulong)fourcc);
              bVar1 = parse_iosg1(this,(MemoryStream *)&substream_3.blob_offset,
                                  &this->output_elements);
              if (!bVar1) {
                this_local._7_1_ = false;
                goto LAB_001d83a8;
              }
            }
            else if (((expected != PatchConstantSignature) && (expected != ResourceDef)) &&
                    (expected != ShaderHash)) {
              if (expected == DXIL) {
LAB_001d81fa:
                FVar2 = DXIL;
                if (reflection) {
                  FVar2 = ShaderStatistics;
                }
                if (FVar2 == expected) {
                  sVar3 = MemoryStream::get_offset
                                    ((MemoryStream *)&container_header.container_size_in_bytes);
                  MemoryStream::create_substream
                            ((MemoryStream *)&substream_1.blob_offset,
                             (MemoryStream *)&container_header.container_size_in_bytes,sVar3,
                             (ulong)fourcc);
                  bVar1 = parse_dxil(this,(MemoryStream *)&substream_1.blob_offset);
                  if (!bVar1) {
                    this_local._7_1_ = false;
                    goto LAB_001d83a8;
                  }
                }
              }
              else if (expected == RuntimeData) {
                sVar3 = MemoryStream::get_offset
                                  ((MemoryStream *)&container_header.container_size_in_bytes);
                MemoryStream::create_substream
                          ((MemoryStream *)local_120,
                           (MemoryStream *)&container_header.container_size_in_bytes,sVar3,
                           (ulong)fourcc);
                bVar1 = parse_rdat(this,(MemoryStream *)local_120);
                if (!bVar1) {
                  this_local._7_1_ = false;
                  goto LAB_001d83a8;
                }
              }
              else if (expected == ShaderStatistics) goto LAB_001d81fa;
            }
          }
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
          ::operator++(&__end1);
        }
        this_local._7_1_ = true;
LAB_001d83a8:
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&i);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DXILContainerParser::parse_container(const void *data, size_t size, bool reflection)
{
	MemoryStream stream(data, size);

	DXIL::ContainerHeader container_header;
	if (!stream.read(container_header))
		return false;

	if (static_cast<DXIL::FourCC>(container_header.header_fourcc) != DXIL::FourCC::Container)
		return false;
	if (container_header.container_size_in_bytes > size)
		return false;

	Vector<uint32_t> parts(container_header.part_count);
	for (uint32_t i = 0; i < container_header.part_count; i++)
	{
		if (!stream.read(parts[i]))
			return false;
	}

	for (auto &part_offset : parts)
	{
		if (!stream.seek(part_offset))
			return false;

		DXIL::PartHeader part_header;
		if (!stream.read(part_header))
			return false;

		auto fourcc = static_cast<DXIL::FourCC>(part_header.part_fourcc);
		switch (fourcc)
		{
		case DXIL::FourCC::DXIL:
		case DXIL::FourCC::ShaderStatistics:
		{
			DXIL::FourCC expected = reflection ? DXIL::FourCC::ShaderStatistics : DXIL::FourCC::DXIL;
			if (expected != fourcc)
				break;

			// The STAT block includes a DXIL blob that is literally the same DXIL IR
			// minus code + string names in the metadata chunks ... <__________________________________<
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_dxil(substream))
				return false;
			break;
		}

		case DXIL::FourCC::FeatureInfo:
			break;

		case DXIL::FourCC::InputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, input_elements))
				return false;
			break;
		}

		case DXIL::FourCC::OutputSignature:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_iosg1(substream, output_elements))
				return false;
			break;
		}

		case DXIL::FourCC::PatchConstantSignature:
			break;

		case DXIL::FourCC::PrivateData:
			break;

		case DXIL::FourCC::RootSignature:
			break;

		case DXIL::FourCC::PipelineStateValidation:
			break;

		case DXIL::FourCC::ResourceDef:
			break;

		case DXIL::FourCC::ShaderHash:
			break;

		case DXIL::FourCC::RuntimeData:
		{
			auto substream = stream.create_substream(stream.get_offset(), part_header.part_size);
			if (!parse_rdat(substream))
				return false;
			break;
		}

		default:
			break;
		}
	}

	return true;
}